

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall reduceDB_lt::operator()(reduceDB_lt *this,CRef x,CRef y)

{
  float fVar1;
  bool bVar2;
  uint *puVar3;
  Clause *pCVar4;
  float *pfVar5;
  
  puVar3 = Minisat::RegionAllocator<unsigned_int>::operator[](&this->ca->ra,x);
  if (*puVar3 < 0x60) {
    bVar2 = false;
  }
  else {
    puVar3 = Minisat::RegionAllocator<unsigned_int>::operator[](&this->ca->ra,y);
    bVar2 = true;
    if ((*puVar3 & 0xffffffe0) != 0x40) {
      pCVar4 = (Clause *)Minisat::RegionAllocator<unsigned_int>::operator[](&this->ca->ra,x);
      pfVar5 = Minisat::Clause::activity(pCVar4);
      fVar1 = *pfVar5;
      pCVar4 = (Clause *)Minisat::RegionAllocator<unsigned_int>::operator[](&this->ca->ra,y);
      pfVar5 = Minisat::Clause::activity(pCVar4);
      bVar2 = fVar1 < *pfVar5;
    }
  }
  return bVar2;
}

Assistant:

bool operator () (CRef x, CRef y) { 
        return ca[x].size() > 2 && (ca[y].size() == 2 || ca[x].activity() < ca[y].activity()); }